

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixin_inheritance.cpp
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Color *c)

{
  Color CVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  CVar1 = *c;
  if (CVar1 == Blue) {
    __s = "blue";
    __a = &local_a;
  }
  else if (CVar1 == Green) {
    __s = "green";
    __a = &local_b;
  }
  else if (CVar1 == Red) {
    __s = "red";
    __a = &local_9;
  }
  else {
    __s = "none";
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Color& c)
{
	switch(c)
	{
	case Color::Red:
		return "red";
	case Color::Blue:
		return "blue";
	case Color::Green:
		return "green";
	default:
		return "none";
	}
}